

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

void substr(char *s,int *start,int *count,int *numargs)

{
  tagval *ptVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  
  sVar4 = strlen(s);
  ptVar1 = commandret;
  uVar2 = (uint)sVar4;
  uVar6 = *start;
  if ((int)uVar2 <= *start) {
    uVar6 = uVar2;
  }
  uVar7 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar7 = 0;
  }
  if (*numargs < 3) {
    iVar8 = uVar2 - (int)uVar7;
  }
  else {
    iVar3 = uVar2 - (int)uVar7;
    if (*count < iVar3) {
      iVar3 = *count;
    }
    iVar8 = 0;
    if (0 < iVar3) {
      iVar8 = iVar3;
    }
  }
  pcVar5 = newstring(s + uVar7,(long)iVar8);
  ptVar1->type = 3;
  (ptVar1->super_identval).field_0.s = pcVar5;
  return;
}

Assistant:

void substr(char *s, int *start, int *count, int *numargs)
{
    int len = strlen(s), offset = clamp(*start, 0, len);
    commandret->setstr(newstring(&s[offset], *numargs >= 3 ? clamp(*count, 0, len - offset) : len - offset));
}